

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::anon_unknown_2::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  Colour colour;
  char local_9;
  
  if ((this->result->m_info).capturedExpression.m_size != 0) {
    local_9 = ';';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->stream,&local_9,1);
    Colour::use(FileName);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this->stream," expression was:",0x10);
    Colour::use(None);
    printOriginalExpression(this);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                Colour colour(dimColour());
                stream << " expression was:";
            }
            printOriginalExpression();
        }
    }